

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  Printer *this_00;
  Descriptor *pDVar1;
  char *pcVar2;
  int __c;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *this_01;
  AlphaNum local_a0;
  string local_70;
  string local_50;
  string_view local_30;
  int local_1c;
  Printer *pPStack_18;
  int bytecode_estimate;
  Printer *printer_local;
  ImmutableExtensionGenerator *this_local;
  
  local_1c = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  pDVar1 = FieldDescriptor::extension_scope(this->descriptor_);
  this_00 = pPStack_18;
  if (pDVar1 == (Descriptor *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"$name$.internalInit(descriptor.getExtensions().get($index$));\n");
    this_01 = this->descriptor_;
    UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_50,(java *)this_01,field);
    pcVar2 = FieldDescriptor::index(this->descriptor_,(char *)this_01,__c);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,(int)pcVar2);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_70,(lts_20250127 *)&local_a0,a);
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (this_00,local_30,(char (*) [5])0xc259cc,&local_50,(char (*) [6])0x99e6cf,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    local_1c = local_1c + 0x15;
  }
  return local_1c;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == nullptr) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        absl::StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}